

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::TParseContext::vkRelaxedRemapUniformVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TPublicType *publicType,
          TArraySizes *param_4,TIntermTyped *initializer,TType *type)

{
  ushort *puVar1;
  byte *pbVar2;
  TSymbolTable *pTVar3;
  undefined4 in_EAX;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *ppTVar6;
  TSymbol *pTVar7;
  undefined4 extraout_var_11;
  TQualifier *dst;
  undefined4 extraout_var_12;
  char *pcVar8;
  mapped_type symbol;
  bool bVar9;
  int bufferBinding;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  vkRelaxedRemapUniformMembers(this,loc,publicType,type,identifier);
  if (((((this->super_TParseContextBase).parsingBuiltins != false) ||
       (pTVar3 = (this->super_TParseContextBase).symbolTable,
       ((long)(pTVar3->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pTVar3->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0x20)) ||
      (iVar4 = (*type->_vptr_TType[10])(type),
      (*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 5)) ||
     (((iVar4 = (*type->_vptr_TType[0x39])(type), (char)iVar4 == '\0' &&
       (iVar4 = (*type->_vptr_TType[7])(type), iVar4 != 0xd)) &&
      ((iVar4 = (*type->_vptr_TType[0x37])(type), (char)iVar4 == '\0' ||
       (iVar4 = (*type->_vptr_TType[0x25])(type), (char)iVar4 == '\0')))))) {
    return false;
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  if ((~*(uint *)(CONCAT44(extraout_var_00,iVar4) + 0x1c) & 0xfff) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"ignoring layout qualifier for uniform");
    iVar4 = (*type->_vptr_TType[10])(type);
    puVar1 = (ushort *)(CONCAT44(extraout_var_01,iVar4) + 0x1c);
    *puVar1 = *puVar1 | 0xfff;
  }
  if (initializer != (TIntermTyped *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"Ignoring initializer for uniform");
  }
  iVar4 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar4 != '\0') {
    iVar4 = (*type->_vptr_TType[10])(type);
    iVar5 = (*type->_vptr_TType[0x14])(type);
    arraySizesCheck(this,loc,(TQualifier *)CONCAT44(extraout_var_02,iVar4),
                    (TArraySizes *)CONCAT44(extraout_var_03,iVar5),(TIntermTyped *)0x0,false);
    iVar4 = (*type->_vptr_TType[10])(type);
    arrayQualifierError(this,loc,(TQualifier *)CONCAT44(extraout_var_04,iVar4));
    arrayError(this,loc,type);
  }
  layoutTypeCheck(this,loc,type);
  uStack_38 = CONCAT44(0xffff,(undefined4)uStack_38);
  if ((char)*(uint *)&type->field_0x8 == '\r') {
    *(uint *)&type->field_0x8 = *(uint *)&type->field_0x8 & 0xffffff09;
    iVar4 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_05,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar4) + 8) & 0xffffffffffffff80 | 6;
    iVar4 = (*type->_vptr_TType[10])(type);
    pbVar2 = (byte *)(CONCAT44(extraout_var_06,iVar4) + 0xe);
    *pbVar2 = *pbVar2 | 4;
    iVar4 = (*type->_vptr_TType[10])(type);
    pbVar2 = (byte *)(CONCAT44(extraout_var_07,iVar4) + 0xe);
    *pbVar2 = *pbVar2 | 2;
    iVar4 = (*type->_vptr_TType[10])(type);
    uStack_38 = (ulong)CONCAT24(*(undefined2 *)(CONCAT44(extraout_var_08,iVar4) + 0x20),
                                (undefined4)uStack_38);
    iVar4 = (*type->_vptr_TType[10])(type);
    *(undefined2 *)(CONCAT44(extraout_var_09,iVar4) + 0x20) = 0xffff;
    iVar4 = (*type->_vptr_TType[10])(type);
    pbVar2 = (byte *)(CONCAT44(extraout_var_10,iVar4) + 0xc);
    *pbVar2 = *pbVar2 & 0xfb;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x41])
              (this,uStack_38 >> 0x20,loc,type,identifier,0);
    ppTVar6 = std::
              map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
              ::operator[](&(this->super_TParseContextBase).atomicCounterBuffers.
                            super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                           ,(key_type_conflict1 *)((long)&uStack_38 + 4));
    symbol = *ppTVar6;
  }
  else {
    symbol = (mapped_type)0x0;
  }
  if (symbol == (mapped_type)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
              (this,loc,type);
    symbol = (this->super_TParseContextBase).globalUniformBlock;
  }
  layoutObjectCheck(this,loc,&symbol->super_TSymbol);
  pTVar7 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  bVar9 = pTVar7 != (TSymbol *)0x0;
  if (bVar9) {
    iVar4 = (*(symbol->super_TSymbol)._vptr_TSymbol[0xd])(symbol);
    dst = (TQualifier *)
          (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x50))
                    ((long *)CONCAT44(extraout_var_11,iVar4));
    iVar4 = (*type->_vptr_TType[10])();
    mergeObjectLayoutQualifiers
              ((TParseContext *)type,dst,(TQualifier *)CONCAT44(extraout_var_12,iVar4),true);
    return bVar9;
  }
  if (symbol == (this->super_TParseContextBase).globalUniformBlock) {
    pcVar8 = "error adding uniform to default uniform block";
  }
  else {
    pcVar8 = "error adding atomic counter to atomic counter block";
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar8,(identifier->_M_dataplus)._M_p,"");
  return bVar9;
}

Assistant:

bool TParseContext::vkRelaxedRemapUniformVariable(const TSourceLoc& loc, TString& identifier, const TPublicType& publicType,
    TArraySizes*, TIntermTyped* initializer, TType& type)
{
    vkRelaxedRemapUniformMembers(loc, publicType, type, identifier);

    if (parsingBuiltins || symbolTable.atBuiltInLevel() || !symbolTable.atGlobalLevel() ||
        type.getQualifier().storage != EvqUniform ||
        !(type.containsNonOpaque() || type.getBasicType() == EbtAtomicUint || (type.containsSampler() && type.isStruct()))) {
        return false;
    }

    if (type.getQualifier().hasLocation()) {
        warn(loc, "ignoring layout qualifier for uniform", identifier.c_str(), "location");
        type.getQualifier().layoutLocation = TQualifier::layoutLocationEnd;
    }

    if (initializer) {
        warn(loc, "Ignoring initializer for uniform", identifier.c_str(), "");
        initializer = nullptr;
    }

    if (type.isArray()) {
        // do array size checks here
        arraySizesCheck(loc, type.getQualifier(), type.getArraySizes(), initializer, false);

        if (arrayQualifierError(loc, type.getQualifier()) || arrayError(loc, type)) {
            error(loc, "array param error", identifier.c_str(), "");
        }
    }

    // do some checking on the type as it was declared
    layoutTypeCheck(loc, type);

    int bufferBinding = TQualifier::layoutBindingEnd;
    TVariable* updatedBlock = nullptr;

    // Convert atomic_uint into members of a buffer block
    if (type.isAtomic()) {
        type.setBasicType(EbtUint);
        type.getQualifier().storage = EvqBuffer;

        type.getQualifier().volatil = true;
        type.getQualifier().coherent = true;

        // xxTODO: use logic from fixOffset() to apply explicit member offset
        bufferBinding = type.getQualifier().layoutBinding;
        type.getQualifier().layoutBinding = TQualifier::layoutBindingEnd;
        type.getQualifier().explicitOffset = false;
        growAtomicCounterBlock(bufferBinding, loc, type, identifier, nullptr);
        updatedBlock = atomicCounterBuffers[bufferBinding];
    }

    if (!updatedBlock) {
        growGlobalUniformBlock(loc, type, identifier, nullptr);
        updatedBlock = globalUniformBlock;
    }

    //
    //      don't assign explicit member offsets here
    //      if any are assigned, need to be updated here and in the merge/link step
    // fixBlockUniformOffsets(updatedBlock->getWritableType().getQualifier(), *updatedBlock->getWritableType().getWritableStruct());

    // checks on update buffer object
    layoutObjectCheck(loc, *updatedBlock);

    TSymbol* symbol = symbolTable.find(identifier);

    if (!symbol) {
        if (updatedBlock == globalUniformBlock)
            error(loc, "error adding uniform to default uniform block", identifier.c_str(), "");
        else
            error(loc, "error adding atomic counter to atomic counter block", identifier.c_str(), "");
        return false;
    }

    // merge qualifiers
    mergeObjectLayoutQualifiers(updatedBlock->getWritableType().getQualifier(), type.getQualifier(), true);

    return true;
}